

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_stream_ack_one
              (quicly_conn_t *conn,quicly_stream_id_t stream_id,quicly_sendstate_sent_t *sent)

{
  int iVar1;
  int iVar2;
  size_t in_RAX;
  quicly_stream_t *stream;
  size_t bytes_to_shift;
  size_t local_18;
  
  local_18 = in_RAX;
  stream = quicly_get_stream(conn,stream_id);
  if (stream == (quicly_stream_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = quicly_sendstate_acked(&stream->sendstate,sent,&local_18);
    if (iVar1 == 0) {
      if (local_18 != 0) {
        (*stream->callbacks->on_send_shift)(stream,local_18);
      }
      iVar2 = stream_is_destroyable(stream);
      if (iVar2 == 0) {
        if ((stream->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
          resched_stream_data(stream);
        }
      }
      else {
        destroy_stream(stream,0);
      }
    }
  }
  return iVar1;
}

Assistant:

static int on_ack_stream_ack_one(quicly_conn_t *conn, quicly_stream_id_t stream_id, quicly_sendstate_sent_t *sent)
{
    quicly_stream_t *stream;
    int ret;

    if ((stream = quicly_get_stream(conn, stream_id)) == NULL)
        return 0;

    size_t bytes_to_shift;
    if ((ret = quicly_sendstate_acked(&stream->sendstate, sent, &bytes_to_shift)) != 0)
        return ret;
    if (bytes_to_shift != 0) {
        QUICLY_PROBE(STREAM_ON_SEND_SHIFT, stream->conn, stream->conn->stash.now, stream, bytes_to_shift);
        stream->callbacks->on_send_shift(stream, bytes_to_shift);
    }
    if (stream_is_destroyable(stream)) {
        destroy_stream(stream, 0);
    } else if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
        resched_stream_data(stream);
    }

    return 0;
}